

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# has_correlated_expressions.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::HasCorrelatedExpressions::VisitReplace
          (HasCorrelatedExpressions *this,BoundColumnRefExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  ExpressionType *pEVar1;
  ExpressionClass EVar2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  Expression *pEVar4;
  const_reference pvVar5;
  BinderException *this_00;
  vector<duckdb::CorrelatedColumnInfo,_true> *this_01;
  size_type __n;
  bool bVar6;
  string local_50;
  
  _Var3._M_head_impl =
       expr_ptr[0xd].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  pEVar4 = (Expression *)(expr->super_Expression).super_BaseExpression.alias._M_string_length;
  if (pEVar4 < _Var3._M_head_impl) {
    if ((undefined1 *)((long)&(pEVar4->super_BaseExpression)._vptr_BaseExpression + 1U) <
        _Var3._M_head_impl) {
      EVar2 = (expr->super_Expression).super_BaseExpression.expression_class;
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      if (EVar2 != AGGREGATE) {
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Expression with depth > 1 detected in non-lateral join","");
        InternalException::InternalException((InternalException *)this_00,(string *)&local_50);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Invalid lateral depth encountered for an expression","");
      BinderException::BinderException(this_00,&local_50);
      __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_01 = (vector<duckdb::CorrelatedColumnInfo,_true> *)
              (expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p;
    if ((this_01->
        super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>).
        super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this_01->
        super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>).
        super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      bVar6 = false;
    }
    else {
      __n = 0;
      do {
        pvVar5 = vector<duckdb::CorrelatedColumnInfo,_true>::operator[](this_01,__n);
        bVar6 = expr_ptr[0xc].
                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                _M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl ==
                (Expression *)(pvVar5->binding).column_index &&
                (Expression *)(pvVar5->binding).table_index ==
                expr_ptr[0xb].
                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                _M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        if (bVar6) break;
        this_01 = (vector<duckdb::CorrelatedColumnInfo,_true> *)
                  (expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p;
        __n = __n + 1;
      } while (__n < (ulong)(((long)(this_01->
                                    super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                    ).
                                    super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_01->
                                    super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                    ).
                                    super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            -0x3333333333333333));
    }
    pEVar1 = &(expr->super_Expression).super_BaseExpression.type;
    *pEVar1 = *pEVar1 | bVar6;
  }
  (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> HasCorrelatedExpressions::VisitReplace(BoundColumnRefExpression &expr,
                                                              unique_ptr<Expression> *expr_ptr) {
	// Indicates local correlations (all correlations within a child) for the root
	if (expr.depth <= lateral_depth) {
		return nullptr;
	}

	// Should never happen
	if (expr.depth > 1 + lateral_depth) {
		if (lateral) {
			throw BinderException("Invalid lateral depth encountered for an expression");
		}
		throw InternalException("Expression with depth > 1 detected in non-lateral join");
	}
	// Note: This is added, since we only want to set has_correlated_expressions to true when the
	// BoundSubqueryExpression has the same bindings as one of the correlated_columns from the left hand side
	// (correlated_columns is the correlated_columns from left hand side)
	bool found_match = false;
	for (idx_t i = 0; i < correlated_columns.size(); i++) {
		if (correlated_columns[i].binding == expr.binding) {
			found_match = true;
			break;
		}
	}
	// correlated column reference
	D_ASSERT(expr.depth == lateral_depth + 1);
	has_correlated_expressions |= found_match;
	return nullptr;
}